

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::HttpSocket::_ProcessChunk(HttpSocket *this)

{
  char **ppcVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  char *__dest;
  char *pcVar5;
  size_t __n;
  int __fd;
  char *pcVar6;
  ulong uVar7;
  
  if (this->_chunkedTransfer == true) {
    uVar7 = 0xffffffff;
    do {
      uVar3 = this->_remaining;
      if (uVar3 != 0) {
        uVar4 = (this->super_TcpSocket)._recvSize;
        if (uVar4 < uVar3) {
          if ((this->_status - 200 < 6) || (this->_alwaysHandle == true)) {
            (*(this->super_TcpSocket)._vptr_TcpSocket[5])
                      (this,(this->super_TcpSocket)._readptr,(ulong)uVar4);
          }
          this->_remaining = this->_remaining - (this->super_TcpSocket)._recvSize;
          (this->super_TcpSocket)._recvSize = 0;
          return;
        }
        pcVar6 = (this->super_TcpSocket)._readptr;
        if ((this->_status - 200 < 6) || (this->_alwaysHandle == true)) {
          (*(this->super_TcpSocket)._vptr_TcpSocket[5])(this,pcVar6,(ulong)(uVar3 - 2));
        }
        __fd = (int)pcVar6;
        uVar3 = this->_remaining;
        ppcVar1 = &(this->super_TcpSocket)._readptr;
        *ppcVar1 = *ppcVar1 + uVar3;
        puVar2 = &(this->super_TcpSocket)._recvSize;
        *puVar2 = *puVar2 - uVar3;
        this->_remaining = 0;
        if ((int)uVar7 == 0) {
          this->_chunkedTransfer = false;
          _DequeueMore(this);
          if (this->_mustClose != true) {
            return;
          }
          TcpSocket::close(&this->super_TcpSocket,__fd);
          return;
        }
      }
      pcVar6 = (this->super_TcpSocket)._readptr;
      pcVar5 = strstr(pcVar6,"\r\n");
      if (pcVar5 == (char *)0x0) {
        if ((this->super_TcpSocket)._recvSize != 0) {
          __dest = (this->super_TcpSocket)._inbuf;
          __n = (long)pcVar6 - (long)__dest;
          memmove(__dest,pcVar6,__n);
          pcVar6 = (this->super_TcpSocket)._inbuf;
          (this->super_TcpSocket)._readptr = pcVar6;
          (this->super_TcpSocket)._writeptr = pcVar6 + __n;
          (this->super_TcpSocket)._writeSize = ~(uint)__n + (this->super_TcpSocket)._inbufSize;
        }
      }
      else {
        uVar7 = strtoul(pcVar6,(char **)0x0,0x10);
        this->_remaining = (int)uVar7 + 2;
        puVar2 = &(this->super_TcpSocket)._recvSize;
        *puVar2 = *puVar2 + (*(int *)&(this->super_TcpSocket)._readptr - (int)(pcVar5 + 2));
        (this->super_TcpSocket)._readptr = pcVar5 + 2;
      }
    } while (pcVar5 != (char *)0x0);
  }
  return;
}

Assistant:

void HttpSocket::_ProcessChunk(void)
{
    if(!_chunkedTransfer)
        return;

    unsigned int chunksize = -1;

    while(true)
    {
        // less data required until chunk end than received, means the new chunk starts somewhere in the middle
        // of the received data block. finish this chunk first.
        if(_remaining)
        {
            if(_remaining <= _recvSize) // it contains the rest of the chunk, including CRLF
            {
                _OnRecvInternal(_readptr, _remaining - 2); // implicitly skip CRLF
                _readptr += _remaining;
                _recvSize -= _remaining;
                _remaining = 0; // done with this one.
                if(!chunksize) // and if chunksize was 0, we are done with all chunks.
                    break;
            }
            else // buffer did not yet arrive completely
            {
                _OnRecvInternal(_readptr, _recvSize);
                _remaining -= _recvSize;
                _recvSize = 0; // done with the whole buffer, but not with the chunk
                return; // nothing else to do here
            }
        }

        // each chunk identifier ends with CRLF.
        // if we don't find that, we hit the corner case that the chunk identifier was not fully received.
        // in that case, adjust the buffer and wait for the rest of the data to be appended
        char *term = strstr(_readptr, "\r\n");
        if(!term)
        {
            if(_recvSize) // if there is still something queued, move it to the left of the buffer and append on next read
                _ShiftBuffer();
            return;
        }
        term += 2; // skip CRLF

        // when we are here, the (next) chunk header was completely received.
        chunksize = strtoul(_readptr, NULL, 16);
        _remaining = chunksize + 2; // the http protocol specifies that each chunk has a trailing CRLF
        _recvSize -= (term - _readptr);
        _readptr = term;
    }

    if(!chunksize) // this was the last chunk, no further data expected unless requested
    {
        _chunkedTransfer = false;
        _DequeueMore();
        if(_recvSize)
            traceprint("_ProcessChunk: There are %u bytes left in the buffer, huh?\n", _recvSize);
        if(_mustClose)
            close();
    }
}